

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::Connection::OnUDPDatagram
          (Connection *this,uint64_t receiveUsec,UDPAddress *addr,DatagramBuffer datagram)

{
  basic_endpoint<asio::ip::udp> *in_RDI;
  type *in_stack_00000008;
  strand *in_stack_00000010;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff78;
  
  std::unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_>::
  operator->((unique_ptr<asio::io_context::strand,_std::default_delete<asio::io_context::strand>_> *
             )0x1a508f);
  asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint(in_RDI,in_stack_ffffffffffffff78);
  asio::io_context::strand::
  post<tonk::Connection::OnUDPDatagram(unsigned_long,asio::ip::basic_endpoint<asio::ip::udp>const&,tonk::DatagramBuffer)::__0>
            (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void Connection::OnUDPDatagram(
    uint64_t receiveUsec,
    const UDPAddress& addr,
    DatagramBuffer datagram)
{
    /*
        TBD: This might be more efficient if we add incoming datagrams to a
        linked list and only post() a task if the list is empty.  This needs
        benchmarking with a real application in order to evaluate the value
        of the extra complexity.  The intent would be to reduce the average
        latency of processing the second (and later) datagrams.
    */
    AsioEventStrand->post([this, receiveUsec, addr, datagram]()
    {
        TONK_DEBUG_ASSERT(AsioEventStrand->running_in_this_thread());
        Result result = this->Incoming.ProcessDatagram(receiveUsec, addr, datagram.Data, datagram.Bytes);
        if (result.IsFail()) {
            onDecodeFailure(result);
        }

        datagram.Free();

        SelfRefCount.DecrementReferences();
    });
}